

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::RegisterValidationInterface
          (ValidationSignals *this,CValidationInterface *callbacks)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks_00;
  element_type local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<CValidationInterface_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_validationinterface_cpp:121:51),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  __allocator_type __a2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._vptr_CValidationInterface = (_func_int **)callbacks;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_38._M_alloc = &__a2;
  (local_40._M_pi)->_M_use_count = 1;
  (local_40._M_pi)->_M_weak_count = 1;
  (local_40._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00a24780;
  local_40._M_pi[1]._vptr__Sp_counted_base = (_func_int **)callbacks;
  local_38._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<CValidationInterface_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:121:51),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48;
  RegisterSharedValidationInterface(this,callbacks_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::RegisterValidationInterface(CValidationInterface* callbacks)
{
    // Create a shared_ptr with a no-op deleter - CValidationInterface lifecycle
    // is managed by the caller.
    RegisterSharedValidationInterface({callbacks, [](CValidationInterface*){}});
}